

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleWriteCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool append)

{
  pointer pbVar1;
  _Ios_Openmode _Var2;
  bool bVar3;
  mode_t mode;
  string fileName;
  string message;
  string dir;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_268 [2];
  char *local_248;
  undefined8 local_240;
  char local_238 [16];
  ofstream file;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&fileName,(string *)(pbVar1 + 1));
  bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar1[1]._M_dataplus._M_p);
  if (!bVar3) {
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::assign((char *)&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,"/",
                   pbVar1 + 1);
    std::__cxx11::string::append((string *)&fileName);
    std::__cxx11::string::~string((string *)&file);
  }
  bVar3 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,fileName._M_dataplus._M_p);
  if (bVar3) {
    cmsys::SystemTools::GetFilenamePath(&dir,&fileName);
    cmsys::SystemTools::MakeDirectory(dir._M_dataplus._M_p);
    mode = 0;
    bVar3 = cmsys::SystemTools::GetPermissions(fileName._M_dataplus._M_p,&mode);
    if (bVar3) {
      cmsys::SystemTools::SetPermissions(fileName._M_dataplus._M_p,mode | 0x90);
    }
    _Var2 = _S_out;
    if (append) {
      _Var2 = _S_app;
    }
    std::ofstream::ofstream(&file,fileName._M_dataplus._M_p,_Var2);
    bVar3 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]]
            & 5) == 0;
    if (bVar3) {
      local_268[0].Begin._M_current = pbVar1 + 2;
      local_268[0].End._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_248 = local_238;
      local_240 = 0;
      local_238[0] = '\0';
      cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&message,local_268,local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&message);
      std::ofstream::close();
      if (mode != 0) {
        cmsys::SystemTools::SetPermissions(fileName._M_dataplus._M_p,mode);
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&message,"failed to open for writing (",(allocator *)local_268);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::~string((string *)local_268);
      std::__cxx11::string::append((char *)&message);
      std::__cxx11::string::append((string *)&message);
      cmCommand::SetError(&this->super_cmCommand,&message);
    }
    std::__cxx11::string::~string((string *)&message);
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    std::operator+(&dir,"attempted to write a file: ",&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,&dir,
                   " into a source directory.");
    std::__cxx11::string::~string((string *)&dir);
    cmCommand::SetError(&this->super_cmCommand,(string *)&file);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::string::~string((string *)&file);
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&fileName);
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleWriteCommand(std::vector<std::string> const& args,
  bool append)
{
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + *i;
    }

  i++;

  if ( !this->Makefile->CanIWriteThisFile(fileName.c_str()) )
    {
    std::string e
      = "attempted to write a file: " + fileName +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir.c_str());

  mode_t mode = 0;

  // Set permissions to writable
  if ( cmSystemTools::GetPermissions(fileName.c_str(), mode) )
    {
    cmSystemTools::SetPermissions(fileName.c_str(),
#if defined( _MSC_VER ) || defined( __MINGW32__ )
      mode | S_IWRITE
#else
      mode | S_IWUSR | S_IWGRP
#endif
    );
    }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(), append?std::ios::app: std::ios::out);
  if ( !file )
    {
    std::string error = "failed to open for writing (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
    }
  std::string message = cmJoin(cmRange(i, args.end()), std::string());
  file << message;
  file.close();
  if(mode)
    {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
    }
  return true;
}